

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O2

void __thiscall
validation_block_tests::processnewblock_signals_ordering::test_method
          (processnewblock_signals_ordering *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long lVar1;
  ChainstateManager *this_00;
  pointer ppCVar2;
  ValidationSignals *pVVar3;
  pointer __last;
  pointer __last_00;
  element_type *peVar4;
  int iVar5;
  CChainParams *pCVar6;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar7;
  Chainstate *pCVar8;
  size_type __n;
  pointer __result;
  thread *ptVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_class_16_2_194bda31_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_194bda31_for__M_head_impl *__args;
  anon_class_16_2_194bda31_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_194bda31_for__M_head_impl *__args_00;
  anon_class_16_2_194bda31_for__M_head_impl *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_03;
  thread *t;
  CBlockIndex *this_01;
  pointer ptVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long in_FS_OFFSET;
  bool bVar13;
  const_string file;
  shared_ptr<CValidationInterface> callbacks;
  shared_ptr<CValidationInterface> callbacks_00;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar14;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  __shared_ptr<CValidationInterface,(__gnu_cxx::_Lock_policy)2> local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  __shared_ptr<CValidationInterface,(__gnu_cxx::_Lock_policy)2> local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  char *local_f8;
  char *local_f0;
  shared_ptr<validation_block_tests::TestSubscriber> sub;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  bool ignored;
  vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_> blocks;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  undefined1 local_78 [16];
  shared_count asStack_68 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  blocks.
  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blocks.
  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blocks.
  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while ((ulong)((long)blocks.
                       super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)blocks.
                      super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) < 800) {
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    clear(&blocks);
    pCVar6 = Params();
    CBlockHeader::GetHash((uint256 *)&criticalblock13,&(pCVar6->genesis).super_CBlockHeader);
    in_R8 = (iterator)0xa;
    in_R9 = (iterator)0x1f4;
    MinerTestingSetup::BuildChain
              (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(uint256 *)&criticalblock13,100,0xf,10,500,
               &blocks);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa2;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  puVar7 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                      ,0xa2,"test_method","m_node.chainman");
  this_00 = (puVar7->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  Params();
  std::make_shared<CBlock,CBlock_const&>((CBlock *)&sub);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)sub.
                super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)sub.
                super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  sub.super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  sub.super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78[0] = (class_property<bool>)
                ChainstateManager::ProcessNewBlock
                          (this_00,(shared_ptr<const_CBlock> *)&threads,true,true,&ignored);
  local_78._8_8_ = (element_type *)0x0;
  asStack_68[0].pi_ = (sp_counted_base *)0x0;
  criticalblock14.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1498563;
  criticalblock14.super_unique_lock._8_8_ =
       (long)
       "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 162, __func__, \"m_node.chainman\")->ProcessNewBlock(std::make_shared<CBlock>(Params().GenesisBlock()), true, true, &ignored)"
       + 0x115;
  criticalblock13.super_unique_lock._8_8_ =
       criticalblock13.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock13.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011481f0;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_f0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)&criticalblock13,1,0,WARN,_cVar14,
             (size_t)&local_f8,0xa2);
  boost::detail::shared_count::~shared_count(asStack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sub.
              super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0xa8,false);
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar8->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar8->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_01 = (CBlockIndex *)0x0;
  }
  else {
    this_01 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  CBlockIndex::GetBlockHash((uint256 *)&criticalblock13,this_01);
  std::make_shared<validation_block_tests::TestSubscriber,uint256>((uint256 *)&sub);
  pVVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
           super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
           super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
           super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
           super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  std::__shared_ptr<CValidationInterface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<validation_block_tests::TestSubscriber,void>
            (local_108,
             &sub.
              super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>
            );
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  ValidationSignals::RegisterSharedValidationInterface(pVVar3,callbacks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,10);
  iVar5 = 10;
  __args = extraout_RDX_00;
  while( true ) {
    __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar13 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (bVar13) break;
    criticalblock13.super_unique_lock._M_device = (mutex_type *)&blocks;
    criticalblock13.super_unique_lock._8_8_ = this;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&threads,1,"vector::_M_realloc_insert");
      __last_00 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            __n);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,validation_block_tests::processnewblock_signals_ordering::test_method()::__0>
                ((allocator_type *)(((long)__last - (long)ptVar10) + (long)__result),
                 (thread *)&criticalblock13,__args_00);
      ptVar9 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar10,__last,__result,(allocator<std::thread> *)&threads);
      ptVar9 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (__last,__last_00,ptVar9 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar10,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar10 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + __n;
      __args = extraout_RDX_02;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar9;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,validation_block_tests::processnewblock_signals_ordering::test_method()::__0>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)&criticalblock13,__args);
      __args = extraout_RDX_01;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  for (; ptVar10 != __last; ptVar10 = ptVar10 + 1) {
    std::thread::join();
  }
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
  pVVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
           super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
           super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
           super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
           super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  std::__shared_ptr<CValidationInterface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<validation_block_tests::TestSubscriber,void>
            (local_138,
             &sub.
              super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>
            );
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX_03._M_pi;
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_138;
  ValidationSignals::UnregisterSharedValidationInterface(pVVar3,callbacks_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130);
  pvVar11 = (iterator)0xcd;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0xcd,false);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xce;
  file_00.m_begin = (iterator)&local_148;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
             msg_00);
  peVar4 = sub.
           super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  criticalblock13.super_unique_lock._8_8_ =
       criticalblock13.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock13.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_160 = "";
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            ((uint256 *)local_78,
             (pCVar8->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&criticalblock13,&local_168,0xce,1,2,&peVar4->m_expected_tip,"sub->m_expected_tip",
             (uint256 *)local_78,"m_node.chainman->ActiveChain().Tip()->GetBlockHash()");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sub.
              super___shared_ptr<validation_block_tests::TestSubscriber,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
  ~vector(&blocks);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(processnewblock_signals_ordering)
{
    // build a large-ish chain that's likely to have some forks
    std::vector<std::shared_ptr<const CBlock>> blocks;
    while (blocks.size() < 50) {
        blocks.clear();
        BuildChain(Params().GenesisBlock().GetHash(), 100, 15, 10, 500, blocks);
    }

    bool ignored;
    // Connect the genesis block and drain any outstanding events
    BOOST_CHECK(Assert(m_node.chainman)->ProcessNewBlock(std::make_shared<CBlock>(Params().GenesisBlock()), true, true, &ignored));
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    // subscribe to events (this subscriber will validate event ordering)
    const CBlockIndex* initial_tip = nullptr;
    {
        LOCK(cs_main);
        initial_tip = m_node.chainman->ActiveChain().Tip();
    }
    auto sub = std::make_shared<TestSubscriber>(initial_tip->GetBlockHash());
    m_node.validation_signals->RegisterSharedValidationInterface(sub);

    // create a bunch of threads that repeatedly process a block generated above at random
    // this will create parallelism and randomness inside validation - the ValidationInterface
    // will subscribe to events generated during block validation and assert on ordering invariance
    std::vector<std::thread> threads;
    threads.reserve(10);
    for (int i = 0; i < 10; i++) {
        threads.emplace_back([&]() {
            bool ignored;
            FastRandomContext insecure;
            for (int i = 0; i < 1000; i++) {
                auto block = blocks[insecure.randrange(blocks.size() - 1)];
                Assert(m_node.chainman)->ProcessNewBlock(block, true, true, &ignored);
            }

            // to make sure that eventually we process the full chain - do it here
            for (const auto& block : blocks) {
                if (block->vtx.size() == 1) {
                    bool processed = Assert(m_node.chainman)->ProcessNewBlock(block, true, true, &ignored);
                    assert(processed);
                }
            }
        });
    }

    for (auto& t : threads) {
        t.join();
    }
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    m_node.validation_signals->UnregisterSharedValidationInterface(sub);

    LOCK(cs_main);
    BOOST_CHECK_EQUAL(sub->m_expected_tip, m_node.chainman->ActiveChain().Tip()->GetBlockHash());
}